

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

statusline checkprotoprefix(Curl_easy *data,connectdata *conn,char *s,size_t len)

{
  _Bool _Var1;
  statusline sVar2;
  
  if ((conn->handler->protocol & 0x40000) == 0) {
    sVar2 = checkhttpprefix(data,s,len);
    return sVar2;
  }
  _Var1 = checkprefixmax("RTSP/",s,len);
  sVar2 = STATUS_BAD;
  if (_Var1) {
    sVar2 = (uint)(4 < len);
  }
  return sVar2;
}

Assistant:

static statusline
checkprotoprefix(struct Curl_easy *data, struct connectdata *conn,
                 const char *s, size_t len)
{
#ifndef CURL_DISABLE_RTSP
  if(conn->handler->protocol & CURLPROTO_RTSP)
    return checkrtspprefix(data, s, len);
#else
  (void)conn;
#endif /* CURL_DISABLE_RTSP */

  return checkhttpprefix(data, s, len);
}